

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

void Cbs2_ManCheckFanouts(Cbs2_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int v;
  
  v = 0;
  while( true ) {
    if (p->pAig->nObjs <= v) {
      return;
    }
    pGVar2 = Gia_ManObj(p->pAig,v);
    if (pGVar2 == (Gia_Obj_t *)0x0) {
      return;
    }
    iVar1 = Vec_IntEntry(&p->vFanout0,v);
    if (iVar1 != 0) {
      __assert_fail("Vec_IntEntry(&p->vFanout0, iObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                    ,0x606,"void Cbs2_ManCheckFanouts(Cbs2_Man_t *)");
    }
    iVar1 = Abc_Var2Lit(v,0);
    iVar1 = Vec_IntEntry(&p->vFanoutN,iVar1);
    if (iVar1 != 0) break;
    iVar1 = Abc_Var2Lit(v,1);
    iVar1 = Vec_IntEntry(&p->vFanoutN,iVar1);
    v = v + 1;
    if (iVar1 != 0) {
      __assert_fail("Vec_IntEntry(&p->vFanoutN, Abc_Var2Lit(iObj, 1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                    ,0x608,"void Cbs2_ManCheckFanouts(Cbs2_Man_t *)");
    }
  }
  __assert_fail("Vec_IntEntry(&p->vFanoutN, Abc_Var2Lit(iObj, 0)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                ,0x607,"void Cbs2_ManCheckFanouts(Cbs2_Man_t *)");
}

Assistant:

void Cbs2_ManCheckFanouts( Cbs2_Man_t * p )
{
    Gia_Obj_t * pObj;
    int iObj;
    Gia_ManForEachObj( p->pAig, pObj, iObj )
    {
        assert( Vec_IntEntry(&p->vFanout0, iObj) == 0 );
        assert( Vec_IntEntry(&p->vFanoutN, Abc_Var2Lit(iObj, 0)) == 0 );
        assert( Vec_IntEntry(&p->vFanoutN, Abc_Var2Lit(iObj, 1)) == 0 );
    }
}